

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::InputInfo::getData(InputInfo *this,int index)

{
  pointer psVar1;
  undefined1 *puVar2;
  
  puVar2 = NullData;
  if ((-1 < index) &&
     (psVar1 = (this->current_data).
               super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index < (int)((ulong)((long)(this->current_data).
                                 super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4)))
  {
    puVar2 = (undefined1 *)(psVar1 + (uint)index);
  }
  return (shared_ptr<const_helics::SmallBuffer> *)puVar2;
}

Assistant:

const std::shared_ptr<const SmallBuffer>& InputInfo::getData(int index) const
{
    if (isValidIndex(index, current_data)) {
        return current_data[index];
    }
    return NullData;
}